

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O3

DdNode * cuddAddIteRecur(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  int *piVar1;
  uint index;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *h_1;
  uint uVar7;
  uint uVar8;
  DdHalfWord index_00;
  uint uVar9;
  uint uVar10;
  DdNode *h_00;
  
  pDVar3 = dd->one;
  pDVar2 = g;
  if ((pDVar3 != f) && (pDVar4 = dd->zero, pDVar2 = h, pDVar4 != f)) {
    if (g == f) {
      g = pDVar3;
    }
    if (h == f) {
      h = pDVar4;
    }
    pDVar2 = g;
    if ((g != h) && (pDVar2 = f, h != pDVar4 || g != pDVar3)) {
      index = f->index;
      uVar9 = 0x7fffffff;
      uVar10 = 0x7fffffff;
      if ((ulong)index != 0x7fffffff) {
        uVar10 = dd->perm[index];
      }
      if ((ulong)g->index != 0x7fffffff) {
        uVar9 = dd->perm[g->index];
      }
      uVar8 = 0x7fffffff;
      if ((ulong)h->index != 0x7fffffff) {
        uVar8 = dd->perm[h->index];
      }
      uVar7 = uVar9;
      if (uVar8 < uVar9) {
        uVar7 = uVar8;
      }
      if ((uVar10 < uVar7) &&
         (((pDVar2 = (f->type).kids.T, pDVar2 == pDVar3 &&
           (pDVar6 = h, pDVar5 = g, (f->type).kids.E == pDVar4)) ||
          ((pDVar2 == pDVar4 && (pDVar6 = g, pDVar5 = h, (f->type).kids.E == pDVar3)))))) {
        pDVar3 = cuddUniqueInter(dd,index,pDVar5,pDVar6);
        return pDVar3;
      }
      pDVar2 = cuddCacheLookup(dd,2,f,g,h);
      if (pDVar2 == (DdNode *)0x0) {
        index_00 = 0xffffffff;
        pDVar2 = f;
        pDVar3 = f;
        if (uVar10 <= uVar7) {
          index_00 = f->index;
          pDVar3 = (f->type).kids.T;
          pDVar2 = (f->type).kids.E;
          uVar7 = uVar10;
        }
        pDVar6 = g;
        pDVar4 = g;
        if (uVar9 == uVar7) {
          index_00 = g->index;
          pDVar4 = (g->type).kids.T;
          pDVar6 = (g->type).kids.E;
        }
        pDVar5 = h;
        h_00 = h;
        if (uVar8 == uVar7) {
          index_00 = h->index;
          pDVar5 = (h->type).kids.T;
          h_00 = (h->type).kids.E;
        }
        pDVar3 = cuddAddIteRecur(dd,pDVar3,pDVar4,pDVar5);
        if (pDVar3 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar2 = cuddAddIteRecur(dd,pDVar2,pDVar6,h_00);
          if (pDVar2 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar4 = pDVar3;
            if ((pDVar3 == pDVar2) ||
               (pDVar4 = cuddUniqueInter(dd,index_00,pDVar3,pDVar2), pDVar4 != (DdNode *)0x0)) {
              piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              cuddCacheInsert(dd,2,f,g,h,pDVar4);
              return pDVar4;
            }
            Cudd_RecursiveDeref(dd,pDVar3);
            pDVar3 = pDVar2;
          }
          Cudd_RecursiveDeref(dd,pDVar3);
        }
        pDVar2 = (DdNode *)0x0;
      }
    }
  }
  return pDVar2;
}

Assistant:

DdNode *
cuddAddIteRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode *one,*zero;
    DdNode *r,*Fv,*Fnv,*Gv,*Gnv,*Hv,*Hnv,*t,*e;
    unsigned int topf,topg,toph,v;
    int index = -1;

    statLine(dd);
    /* Trivial cases. */

    /* One variable cases. */
    if (f == (one = DD_ONE(dd))) {      /* ITE(1,G,H) = G */
        return(g);
    }
    if (f == (zero = DD_ZERO(dd))) {    /* ITE(0,G,H) = H */
        return(h);
    }

    /* From now on, f is known to not be a constant. */
    addVarToConst(f,&g,&h,one,zero);

    /* Check remaining one variable cases. */
    if (g == h) {                       /* ITE(F,G,G) = G */
        return(g);
    }

    if (g == one) {                     /* ITE(F,1,0) = F */
        if (h == zero) return(f);
    }

    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);
    toph = cuddI(dd,h->index);
    v = ddMin(topg,toph);

    /* A shortcut: ITE(F,G,H) = (x,G,H) if F=(x,1,0), x < top(G,H). */
    if (topf < v && cuddT(f) == one && cuddE(f) == zero) {
        r = cuddUniqueInter(dd,(int)f->index,g,h);
        return(r);
    }
    if (topf < v && cuddT(f) == zero && cuddE(f) == one) {
        r = cuddUniqueInter(dd,(int)f->index,h,g);
        return(r);
    }

    /* Check cache. */
    r = cuddCacheLookup(dd,DD_ADD_ITE_TAG,f,g,h);
    if (r != NULL) {
        return(r);
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf,v);      /* v = top_var(F,G,H) */
        index = f->index;
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topg == v) {
        index = g->index;
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }
    if (toph == v) {
        index = h->index;
        Hv = cuddT(h); Hnv = cuddE(h);
    } else {
        Hv = Hnv = h;
    }
    
    /* Recursive step. */
    t = cuddAddIteRecur(dd,Fv,Gv,Hv);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddAddIteRecur(dd,Fnv,Gnv,Hnv);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);

    r = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd,t);
        Cudd_RecursiveDeref(dd,e);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);

    cuddCacheInsert(dd,DD_ADD_ITE_TAG,f,g,h,r);

    return(r);

}